

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

int rw::Engine::close(int __fd)

{
  FILE *__stream;
  int iVar1;
  int extraout_EAX;
  char *pcVar2;
  uint i;
  long lVar3;
  Error _e;
  
  if ((engine == 0) || (state != 2)) {
    _e.plugin = 0;
    _e.code = 0x80000001;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/engine.cpp",0x15d);
    __stream = _stderr;
    pcVar2 = dbgsprint(0x80000001);
    fprintf(__stream,"%s\n",pcVar2);
    setError(&_e);
    iVar1 = extraout_EAX;
  }
  else {
    (**(code **)(engine + 0x140))(3,0,0);
    for (lVar3 = 0; lVar3 != 0xd; lVar3 = lVar3 + 1) {
      (*DAT_00144da0)(*(undefined8 *)(engine + 0x58 + lVar3 * 8));
    }
    ObjPipeline::destroy(*(ObjPipeline **)(engine + 0x148));
    iVar1 = (*DAT_00144da0)(engine);
    engine = 0;
    state = 1;
  }
  return iVar1;
}

Assistant:

void
Engine::close(void)
{
	if(engine == nil || Engine::state != Opened){
		RWERROR((ERR_GENERAL));
		return;
	}

	engine->device.system(DEVICECLOSE, nil, 0);
	for(uint i = 0; i < NUM_PLATFORMS; i++)
		rwFree(rw::engine->driver[i]);
	engine->dummyDefaultPipeline->destroy();
	rwFree(engine);
	engine = nil;
	Engine::state = Initialized;
}